

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * __thiscall
dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling
          (CFGStructurizer *this,CFGNode *node,CFGNode *header,CFGNode *loop_ladder,
          CFGNode *target_header,CFGNode *full_break_target,
          UnorderedSet<const_CFGNode_*> *normal_preds)

{
  long lVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  uint uVar4;
  CFGNode *pCVar5;
  CFGNode *pCVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  __node_base *p_Var12;
  long lVar13;
  pointer ppCVar14;
  pointer ppCVar15;
  value_type local_10a0;
  Vector<CFGNode_*> linear_visitation_cache;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1058;
  UnorderedSet<CFGNode_*> visitation_cache;
  
  if (target_header == (CFGNode *)0x0 && full_break_target == (CFGNode *)0x0) {
    if ((loop_ladder->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (loop_ladder->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      traverse_dominated_blocks_and_rewrite_branch(this,header,node,loop_ladder);
      return (CFGNode *)0x0;
    }
    pCVar5 = create_helper_pred_block(this,loop_ladder);
    pCVar6 = create_helper_succ_block(this,loop_ladder);
    traverse_dominated_blocks_and_rewrite_branch(this,header,node,pCVar5);
    visitation_cache._M_h._M_bucket_count._0_6_ = 0;
    visitation_cache._M_h._M_bucket_count._6_2_ = 0;
    visitation_cache._M_h._M_buckets = (__buckets_ptr)normal_preds;
    visitation_cache._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:6670:5)>
         ::_M_invoke;
    visitation_cache._M_h._M_before_begin._M_nxt._0_6_ = 0x13ae0e;
    visitation_cache._M_h._M_before_begin._M_nxt._6_2_ = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&local_1058,"ladder_phi_",(ThreadLocalAllocator<char> *)&local_10a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&linear_visitation_cache,&local_1058,&loop_ladder->name);
    rewrite_ladder_conditional_branch_from_incoming_blocks
              (this,pCVar5,pCVar6,loop_ladder,
               (function<bool_(const_dxil_spv::CFGNode_*)> *)&visitation_cache,
               (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               &linear_visitation_cache);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&linear_visitation_cache);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&local_1058);
    if ((code *)CONCAT26(visitation_cache._M_h._M_before_begin._M_nxt._6_2_,
                         visitation_cache._M_h._M_before_begin._M_nxt._0_6_) == (code *)0x0) {
      return pCVar5;
    }
    (*(code *)CONCAT26(visitation_cache._M_h._M_before_begin._M_nxt._6_2_,
                       visitation_cache._M_h._M_before_begin._M_nxt._0_6_))
              (&visitation_cache,&visitation_cache,3);
    return pCVar5;
  }
  pCVar5 = create_helper_pred_block(this,loop_ladder);
  ppCVar15 = (node->headers).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(node->headers).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar15 >> 3;
  for (uVar4 = 0; uVar9 = (uint)uVar10, uVar9 != uVar4; uVar4 = uVar4 + 1) {
    uVar11 = (ulong)uVar4;
    uVar9 = uVar4;
    if (ppCVar15[uVar11] == header) goto LAB_00135e32;
  }
  uVar11 = uVar10 & 0xffffffff;
LAB_00135e32:
  if (uVar10 == uVar11) {
    __assert_fail("header_index != node->headers.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x19bf,
                  "CFGNode *dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *, CFGNode *, CFGNode *, CFGNode *, CFGNode *, const UnorderedSet<const CFGNode *> &)"
                 );
  }
  if (((uVar9 != 0) || (node->succ_back_edge != node && node->succ_back_edge != (CFGNode *)0x0)) &&
     (local_1058._M_dataplus._M_p = (pointer)node, local_1058._M_string_length._0_4_ = uVar9,
     pCVar5 != node)) {
    visitation_cache._M_h._M_buckets = &visitation_cache._M_h._M_single_bucket;
    visitation_cache._M_h._M_bucket_count._0_6_ = 1;
    visitation_cache._M_h._M_bucket_count._6_2_ = 0;
    p_Var12 = &visitation_cache._M_h._M_before_begin;
    visitation_cache._M_h._M_before_begin._M_nxt._0_6_ = 0;
    visitation_cache._M_h._M_before_begin._M_nxt._6_2_ = 0;
    visitation_cache._M_h._M_element_count = 0;
    visitation_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    visitation_cache._M_h._M_rehash_policy._M_next_resize = 0;
    visitation_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
    traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>
              (this,header,header,node,pCVar5,(anon_class_16_2_63404077 *)&local_1058,
               &visitation_cache);
    CFGNode::fixup_merge_info_after_branch_rewrite(header,node,pCVar5);
    linear_visitation_cache.
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linear_visitation_cache.
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linear_visitation_cache.
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
              (&linear_visitation_cache,visitation_cache._M_h._M_element_count);
    while (ppCVar3 = linear_visitation_cache.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppCVar15 = linear_visitation_cache.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start, p_Var12 = p_Var12->_M_nxt,
          p_Var12 != (__node_base *)0x0) {
      local_10a0 = *(value_type *)(p_Var12 + 1);
      if ((CFGNode *)((_Hash_node_base *)((long)local_10a0 + 0x120))->_M_nxt == node) {
        if (((_Hash_node_base *)((long)local_10a0 + 0x158))->_M_nxt ==
            ((_Hash_node_base *)((long)local_10a0 + 0x160))->_M_nxt) {
          ((_Hash_node_base *)((long)local_10a0 + 0x120))->_M_nxt = (_Hash_node_base *)0x0;
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back(&linear_visitation_cache,&local_10a0);
        }
        else {
          ((_Hash_node_base *)((long)local_10a0 + 0x120))->_M_nxt = (_Hash_node_base *)pCVar5;
        }
      }
    }
    ppCVar2 = linear_visitation_cache.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (linear_visitation_cache.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        linear_visitation_cache.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = (long)linear_visitation_cache.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)linear_visitation_cache.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = lVar13 >> 3;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                (linear_visitation_cache.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 linear_visitation_cache.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar15,ppCVar3);
        ppCVar15 = linear_visitation_cache.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = linear_visitation_cache.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ppCVar14 = ppCVar15 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar15,ppCVar14);
        for (; ppCVar15 = linear_visitation_cache.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
            ppCVar2 = linear_visitation_cache.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish, ppCVar14 != ppCVar3;
            ppCVar14 = ppCVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Val_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                    (ppCVar14);
        }
      }
    }
    for (; ppCVar15 != ppCVar2; ppCVar15 = ppCVar15 + 1) {
      if ((*ppCVar15)->immediate_post_dominator == (CFGNode *)0x0) {
        CFGNode::recompute_immediate_post_dominator(*ppCVar15);
      }
    }
    CFGNode::recompute_immediate_post_dominator(header);
    std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
    ~_Vector_base(&linear_visitation_cache.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 );
    std::
    _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&visitation_cache._M_h);
  }
  if (target_header == (CFGNode *)0x0) {
    pCVar6 = full_break_target;
    if (full_break_target == (CFGNode *)0x0) {
LAB_00136125:
      p_Var7 = get_thread_log_callback();
      if (p_Var7 != (LoggingCallback)0x0) {
        visitation_cache._M_h._M_buckets = (__buckets_ptr)0x20706f6f6c206f4e;
        visitation_cache._M_h._M_bucket_count._0_6_ = 0x20656772656d;
        visitation_cache._M_h._M_bucket_count._6_2_ = 0x6c62;
        visitation_cache._M_h._M_before_begin._M_nxt._0_6_ = 0xa3f6b636f;
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Warn,(char *)&visitation_cache);
        return pCVar5;
      }
      fwrite("[WARN]: No loop merge block?\n",0x1d,1,_stderr);
      fflush(_stderr);
      return pCVar5;
    }
  }
  else {
    pCVar6 = target_header->loop_ladder_block;
    if (target_header->loop_ladder_block == (CFGNode *)0x0) {
      pCVar6 = target_header->loop_merge_block;
      if (full_break_target == (CFGNode *)0x0 && pCVar6 == (CFGNode *)0x0) goto LAB_00136125;
      if (pCVar6 != (CFGNode *)0x0) {
        full_break_target = pCVar6;
      }
      pCVar6 = full_break_target;
      if (full_break_target == (CFGNode *)0x0) {
        return pCVar5;
      }
    }
  }
  visitation_cache._M_h._M_bucket_count._0_6_ = 0;
  visitation_cache._M_h._M_bucket_count._6_2_ = 0;
  visitation_cache._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:6629:30)>
       ::_M_invoke;
  visitation_cache._M_h._M_before_begin._M_nxt._0_6_ = 0x13adce;
  visitation_cache._M_h._M_before_begin._M_nxt._6_2_ = 0;
  visitation_cache._M_h._M_buckets = (__buckets_ptr)normal_preds;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_1058,"ladder_phi_",(ThreadLocalAllocator<char> *)&local_10a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&linear_visitation_cache,&local_1058,&loop_ladder->name);
  rewrite_ladder_conditional_branch_from_incoming_blocks
            (this,pCVar5,pCVar6,loop_ladder,
             (function<bool_(const_dxil_spv::CFGNode_*)> *)&visitation_cache,
             (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             &linear_visitation_cache);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             &linear_visitation_cache);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&local_1058);
  if ((code *)CONCAT26(visitation_cache._M_h._M_before_begin._M_nxt._6_2_,
                       visitation_cache._M_h._M_before_begin._M_nxt._0_6_) != (code *)0x0) {
    (*(code *)CONCAT26(visitation_cache._M_h._M_before_begin._M_nxt._6_2_,
                       visitation_cache._M_h._M_before_begin._M_nxt._0_6_))
              (&visitation_cache,&visitation_cache,3);
  }
  pCVar6 = (pCVar5->ir).terminator.true_block;
  if (pCVar6 == (pCVar5->ir).terminator.false_block) {
    (pCVar5->ir).terminator.direct_block = pCVar6;
    (pCVar5->ir).terminator.type = Branch;
  }
  return pCVar5;
}

Assistant:

CFGNode *CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *node, CFGNode *header,
                                                                        CFGNode *loop_ladder,
                                                                        CFGNode *target_header,
                                                                        CFGNode *full_break_target,
                                                                        const UnorderedSet<const CFGNode *> &normal_preds)
{
	CFGNode *new_ladder_block = nullptr;

	if (target_header || full_break_target)
	{
		// If we have a ladder block, there exists a merge candidate which the loop header dominates.
		// We create a ladder block before the merge block, which becomes the true merge block.
		// In this ladder block, we can detect with Phi nodes whether the break was "clean",
		// or if we had an escape edge.
		// If we have an escape edge, we can break to outer level, and continue the ladder that way.
		// Otherwise we branch to the existing merge block and continue as normal.
		// We'll also need to rewrite a lot of Phi nodes this way as well.
		auto *ladder = create_helper_pred_block(loop_ladder);
		new_ladder_block = ladder;

		unsigned header_index;
		for (header_index = 0; header_index < uint32_t(node->headers.size()); header_index++)
			if (node->headers[header_index] == header)
				break;

		assert(header_index != node->headers.size());

		// Merge to ladder instead.
		// If we're fixing up ladders for header index 0 it means we've already rewritten everything,
		// only apply the last fixup branch.
		if (header_index != 0 || block_is_plain_continue(node))
		{
			traverse_dominated_blocks_and_rewrite_branch(
				header, node, ladder,
				[node, header_index](const CFGNode *next)
				{
					for (unsigned i = 0; i < header_index; i++)
					{
						auto *target = node->headers[i];
						// Do not introduce cycles. Outer scopes must never be rewritten to branch to inner scopes.
						if (target && target->loop_ladder_block == next)
							return false;
					}
					return true;
				});
		}

		CFGNode *true_block = nullptr;

		// Ladder breaks out to outer scope.
		if (target_header && target_header->loop_ladder_block)
			true_block = target_header->loop_ladder_block;
		else if (target_header && target_header->loop_merge_block)
			true_block = target_header->loop_merge_block;
		else if (full_break_target)
			true_block = full_break_target;
		else
			LOGW("No loop merge block?\n");

		if (true_block)
		{
			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder,
				true_block, loop_ladder, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			// This can happen in some scenarios, fixup the branch to be a direct one instead.
			if (ladder->ir.terminator.true_block == ladder->ir.terminator.false_block)
			{
				ladder->ir.terminator.direct_block = ladder->ir.terminator.true_block;
				ladder->ir.terminator.type = Terminator::Type::Branch;
			}
		}
	}
	else
	{
		// Here, loop_ladder -> final merge is a trivial, direct branch.

		if (loop_ladder->ir.operations.empty())
		{
			// Simplest common case.
			// If the loop ladder just branches to outer scope, and this block does not perform
			// any operations we can avoid messing around with ladder PHI variables and just execute the branch.
			// This block will likely become a frontier node when merging PHI instead.
			// This is a common case when breaking out of a simple for loop.
			traverse_dominated_blocks_and_rewrite_branch(header, node, loop_ladder);
		}
		else
		{
			// We have a case where we're trivially breaking out of a selection construct,
			// but the loop ladder block contains operations which we must not execute,
			// since we were supposed to branch directly out to node.
			// We cannot directly break out of a selection construct, so our ladder must be a bit more sophisticated.
			// ladder-pre -> merge -> ladder-post -> selection merge
			//      \-------------------/
			auto *ladder_pre = create_helper_pred_block(loop_ladder);
			auto *ladder_post = create_helper_succ_block(loop_ladder);

			// Merge to ladder instead.
			traverse_dominated_blocks_and_rewrite_branch(header, node, ladder_pre);

			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder_pre,
				ladder_post, loop_ladder,
				[&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			new_ladder_block = ladder_pre;
		}
	}

	return new_ladder_block;
}